

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkSampleLocationsInfoEXT *info,ScratchAllocator *alloc)

{
  VkSampleLocationsInfoEXT *pVVar1;
  VkSampleLocationEXT *pVVar2;
  
  pVVar1 = copy<VkSampleLocationsInfoEXT>(this,info,1,alloc);
  pVVar2 = copy<VkSampleLocationEXT>
                     (this,pVVar1->pSampleLocations,(ulong)pVVar1->sampleLocationsCount,alloc);
  pVVar1->pSampleLocations = pVVar2;
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkSampleLocationsInfoEXT *info, ScratchAllocator &alloc)
{
	auto *loc = copy(info, 1, alloc);
	loc->pSampleLocations = copy(loc->pSampleLocations, loc->sampleLocationsCount, alloc);
	return loc;
}